

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FilePath_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  DescriptorStringView this_00;
  ulong uVar1;
  string *directory_00;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  string_view path;
  string_view filename;
  string_view input;
  AlphaNum local_1d8;
  AlphaNum local_1a8;
  undefined1 local_178 [16];
  string local_168;
  undefined1 local_148 [16];
  string local_138;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  string directory;
  string basename;
  string output;
  FileDescriptor *file_local;
  
  std::__cxx11::string::string((string *)(basename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(directory.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  this_00 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  directory_00 = (string *)((long)&directory.field_2 + 8);
  path._M_str = local_78;
  path._M_len = local_88._8_8_;
  anon_unknown_0::PathSplit
            (local_88._0_8_,path,directory_00,(string *)CONCAT71(in_register_00000081,in_R8B));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_118,"/");
    absl::lts_20240722::StrCat_abi_cxx11_(&local_b8,&local_e8);
    std::__cxx11::string::operator=
              ((string *)(basename.field_2._M_local_buf + 8),(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  local_148 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(directory.field_2._M_local_buf + 8));
  filename._M_len = local_148._8_8_;
  filename._M_str = (char *)directory_00;
  StripProto_abi_cxx11_(&local_138,local_148._0_8_,filename);
  std::__cxx11::string::operator=
            ((string *)(directory.field_2._M_local_buf + 8),(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  local_178 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(directory.field_2._M_local_buf + 8));
  input._M_len = local_178._8_8_;
  input._M_str = (char *)0x1;
  (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            (&local_168,local_178._0_8_,input,(bool)in_R8B);
  std::__cxx11::string::operator=
            ((string *)(directory.field_2._M_local_buf + 8),(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_1a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&basename.field_2 + 8));
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&directory.field_2 + 8));
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_1a8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(directory.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(basename.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string FilePath(const FileDescriptor* file) {
  std::string output;
  std::string basename;
  std::string directory;
  PathSplit(file->name(), &directory, &basename);
  if (!directory.empty()) {
    output = absl::StrCat(directory, "/");
  }
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  basename = UnderscoresToCamelCase(basename, true);

  return absl::StrCat(output, basename);
}